

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmMakefileTargetGenerator::GetResponseFlag_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,ResponseFlagFor mode)

{
  cmGeneratorTarget *this_00;
  cmValue cVar1;
  string responseFlagVar;
  string lang;
  string local_e0;
  string local_c0;
  cmAlphaNum local_a0;
  string local_70;
  cmAlphaNum local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"@",(allocator<char> *)&local_a0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&local_a0,this);
  cmGeneratorTarget::GetLinkerLanguage(&local_c0,this_00,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (mode == DeviceLink) {
    std::__cxx11::string::assign((char *)&local_e0);
  }
  else if (mode == Link) {
    local_a0.View_._M_len = (size_t)&DAT_00000006;
    local_a0.View_._M_str = "CMAKE_";
    local_50.View_._M_len = local_c0._M_string_length;
    local_50.View_._M_str = local_c0._M_dataplus._M_p;
    cmStrCat<char[25]>(&local_70,&local_a0,&local_50,(char (*) [25])"_RESPONSE_FILE_LINK_FLAG");
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  cVar1 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_e0);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetResponseFlag(
  ResponseFlagFor mode) const
{
  std::string responseFlag = "@";
  std::string responseFlagVar;

  auto lang = this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  if (mode == cmMakefileTargetGenerator::ResponseFlagFor::Link) {
    responseFlagVar = cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_LINK_FLAG");
  } else if (mode == cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink) {
    responseFlagVar = "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG";
  }

  if (cmValue p = this->Makefile->GetDefinition(responseFlagVar)) {
    responseFlag = *p;
  }
  return responseFlag;
}